

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbus.c
# Opt level: O0

int nn_xbus_send(nn_sockbase *self,nn_msg *msg)

{
  int iVar1;
  size_t sVar2;
  nn_chunkref *in_RSI;
  nn_chunkref *in_RDI;
  nn_pipe *exclude;
  size_t hdrsz;
  nn_pipe *in_stack_00000058;
  nn_msg *in_stack_00000060;
  nn_dist *in_stack_00000068;
  nn_chunkref *in_stack_ffffffffffffffd0;
  
  sVar2 = nn_chunkref_size(in_stack_ffffffffffffffd0);
  if (sVar2 != 0) {
    if (sVar2 != 8) {
      return -0x16;
    }
    nn_chunkref_data(in_RSI);
    nn_chunkref_term(in_stack_ffffffffffffffd0);
    nn_chunkref_init(in_RDI,(size_t)in_RSI);
  }
  iVar1 = nn_dist_send(in_stack_00000068,in_stack_00000060,in_stack_00000058);
  return iVar1;
}

Assistant:

int nn_xbus_send (struct nn_sockbase *self, struct nn_msg *msg)
{
    size_t hdrsz;
    struct nn_pipe *exclude;

    hdrsz = nn_chunkref_size (&msg->sphdr);
    if (hdrsz == 0)
        exclude = NULL;
    else if (hdrsz == sizeof (uint64_t)) {
        memcpy (&exclude, nn_chunkref_data (&msg->sphdr), sizeof (exclude));
        nn_chunkref_term (&msg->sphdr);
        nn_chunkref_init (&msg->sphdr, 0);
    }
    else
        return -EINVAL;

    return nn_dist_send (&nn_cont (self, struct nn_xbus, sockbase)->outpipes,
        msg, exclude);
}